

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O1

_Bool bitset_container_iterate
                (bitset_container_t *cont,uint32_t base,roaring_iterator iterator,void *ptr)

{
  long lVar1;
  _Bool _Var2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  _Bool _Var6;
  
  uVar5 = 0;
  _Var6 = false;
  do {
    uVar4 = cont->words[uVar5];
    do {
      uVar3 = uVar4;
      if (uVar3 == 0) {
        base = base + 0x40;
        break;
      }
      lVar1 = 0;
      if (uVar3 != 0) {
        for (; (uVar3 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
        }
      }
      _Var2 = (*iterator)((int)lVar1 + base,ptr);
      if (_Var2) {
        uVar4 = uVar3 - 1;
      }
      else {
        uVar4 = 0xffffffffffffffff;
      }
      uVar4 = uVar4 & uVar3;
    } while (_Var2);
    if (uVar3 != 0) {
      return _Var6;
    }
    _Var6 = 0x3fe < uVar5;
    uVar5 = uVar5 + 1;
    if (uVar5 == 0x400) {
      return _Var6;
    }
  } while( true );
}

Assistant:

bool bitset_container_iterate(const bitset_container_t *cont, uint32_t base, roaring_iterator iterator, void *ptr) {
  for (int32_t i = 0; i < BITSET_CONTAINER_SIZE_IN_WORDS; ++i ) {
    uint64_t w = cont->words[i];
    while (w != 0) {
      uint64_t t = w & (~w + 1);
      int r = roaring_trailing_zeroes(w);
      if(!iterator(r + base, ptr)) return false;
      w ^= t;
    }
    base += 64;
  }
  return true;
}